

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreateTexture::CreateTexture
          (CreateTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,
          bool serverSync)

{
  Texture *this_00;
  undefined1 local_60 [16];
  undefined1 local_50 [54];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  CreateTexture *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this;
  Operation::Operation(&this->super_Operation,"CreateTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateTexture_03277608;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture);
  this_00 = (Texture *)operator_new(0x78);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_50);
  Operation::getSync((Operation *)local_60);
  GLES2ThreadTest::Texture::Texture
            (this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_50,
             (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)(local_50 + 0x10),this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=
            (pSStack_18,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)(local_50 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)(local_50 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_60);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(&this->m_texture,pSStack_18);
  return;
}

Assistant:

CreateTexture::CreateTexture (SharedPtr<Texture>& texture, bool useSync, bool serverSync)
	: Operation	("CreateTexture", useSync, serverSync)
{
	texture = SharedPtr<Texture>(new Texture(getEvent(), getSync()));
	m_texture = texture;
}